

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O1

void RescalerImportRowShrink_SSE2(WebPRescaler *wrk,uint8_t *src)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined7 uVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  unkbyte10 Var7;
  unkbyte10 Var8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  rescaler_t *prVar12;
  rescaler_t *prVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ushort uVar26;
  byte bVar29;
  short sVar30;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar31 [16];
  undefined4 uVar33;
  short sVar34;
  undefined1 auVar32 [16];
  undefined4 uVar35;
  
  if ((wrk->num_channels == 4) && (uVar3 = wrk->x_sub, wrk->x_add <= (int)(uVar3 * 0x80))) {
    if (0 < wrk->dst_width) {
      auVar22 = pshuflw(ZEXT416(uVar3),ZEXT416(uVar3),0);
      auVar23._0_4_ = auVar22._0_4_;
      auVar23._4_4_ = auVar23._0_4_;
      auVar23._8_4_ = auVar23._0_4_;
      auVar23._12_4_ = auVar23._0_4_;
      uVar19 = wrk->fx_scale;
      prVar13 = wrk->frow;
      prVar12 = prVar13 + (long)wrk->dst_width * 4;
      iVar16 = 0;
      auVar24 = (undefined1  [16])0x0;
      do {
        bVar21 = SCARRY4(iVar16,wrk->x_add);
        iVar16 = iVar16 + wrk->x_add;
        auVar28 = auVar24;
        if (iVar16 == 0 || bVar21 != iVar16 < 0) {
          auVar27 = (undefined1  [16])0x0;
        }
        else {
          do {
            uVar33 = *(undefined4 *)src;
            src = src + 4;
            bVar29 = (byte)((uint)uVar33 >> 0x18);
            uVar4 = CONCAT25((short)(((uint7)bVar29 << 0x30) >> 0x28),
                             CONCAT14((char)((uint)uVar33 >> 0x10),uVar33));
            uVar26 = (ushort)uVar33;
            uVar9 = (ulong)CONCAT43((int)(CONCAT34((int3)((uint7)uVar4 >> 0x20),uVar33) >> 0x18),
                                    CONCAT12((char)((uint)uVar33 >> 8),uVar26)) & 0xffffffff00ffffff
            ;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = CONCAT62((int6)(uVar9 >> 0x10),uVar26) & 0xffffffffffff00ff;
            auVar24._0_2_ = auVar28._0_2_ + (uVar26 & 0xff);
            auVar24._2_2_ = auVar28._2_2_ + (short)(uVar9 >> 0x10);
            auVar24._4_2_ = auVar28._4_2_ + (short)((uint7)uVar4 >> 0x20);
            auVar24._6_2_ = auVar28._6_2_ + (ushort)bVar29;
            auVar24._8_2_ = auVar28._8_2_;
            auVar24._10_2_ = auVar28._10_2_;
            auVar24._12_2_ = auVar28._12_2_;
            auVar24._14_2_ = auVar28._14_2_;
            iVar16 = iVar16 - uVar3;
            auVar28 = auVar24;
          } while (0 < iVar16);
        }
        auVar31 = pshuflw(ZEXT416((uint)-iVar16),ZEXT416((uint)-iVar16),0);
        auVar28._0_4_ = auVar31._0_4_;
        auVar28._4_4_ = auVar28._0_4_;
        auVar28._8_4_ = auVar28._0_4_;
        auVar28._12_4_ = auVar28._0_4_;
        sVar34 = auVar31._2_2_ * auVar27._6_2_;
        auVar28 = pmulhuw(auVar27,auVar28);
        iVar1 = CONCAT22(auVar28._6_2_,sVar34);
        Var7 = CONCAT64(CONCAT42(iVar1,auVar28._4_2_),CONCAT22(auVar31._0_2_ * auVar27._4_2_,sVar34)
                       );
        uVar9 = (ulong)((unkuint10)Var7 >> 0x10);
        auVar5._4_8_ = uVar9;
        auVar5._2_2_ = auVar28._2_2_;
        auVar5._0_2_ = auVar31._2_2_ * auVar27._2_2_;
        auVar32._0_4_ = CONCAT22(auVar28._0_2_,auVar31._0_2_ * auVar27._0_2_);
        auVar32._4_12_ = auVar5;
        sVar34 = auVar24._0_2_;
        sVar30 = auVar24._6_2_ * auVar22._2_2_;
        auVar28 = pmulhuw(auVar24,auVar23);
        iVar2 = CONCAT22(auVar28._6_2_,sVar30);
        Var8 = CONCAT64(CONCAT42(iVar2,auVar28._4_2_),CONCAT22(auVar24._4_2_ * auVar22._0_2_,sVar30)
                       );
        auVar6._4_8_ = (long)((unkuint10)Var8 >> 0x10);
        auVar6._2_2_ = auVar28._2_2_;
        auVar6._0_2_ = auVar24._2_2_ * auVar22._2_2_;
        uVar33 = (undefined4)((ulong)auVar32._0_4_ * (ulong)uVar19 + 0x80000000 >> 0x20);
        uVar35 = (undefined4)((uVar9 & 0xffffffff) * (ulong)uVar19 + 0x80000000 >> 0x20);
        auVar25._4_4_ = uVar35;
        auVar25._0_4_ = uVar33;
        auVar25._8_4_ = uVar35;
        auVar25._12_4_ = (int)((uVar9 >> 0x20) * (ulong)uVar19 + 0x80000000 >> 0x20);
        auVar31._8_8_ = auVar25._8_8_;
        auVar31._4_4_ = (int)((auVar32._0_8_ >> 0x20) * (ulong)uVar19 + 0x80000000 >> 0x20);
        auVar31._0_4_ = uVar33;
        auVar24 = packssdw(auVar31,(undefined1  [16])0x0);
        *prVar13 = CONCAT22(auVar28._0_2_,sVar34 * auVar22._0_2_) - auVar32._0_4_;
        prVar13[1] = auVar6._0_4_ - auVar5._0_4_;
        prVar13[2] = (int)((unkuint10)Var8 >> 0x10) - (int)((unkuint10)Var7 >> 0x10);
        prVar13[3] = iVar2 - iVar1;
        prVar13 = prVar13 + 4;
      } while (prVar13 < prVar12);
    }
    return;
  }
  uVar9 = (ulong)wrk->num_channels;
  if (0 < (long)uVar9) {
    iVar16 = wrk->dst_width * wrk->num_channels;
    uVar11 = 0;
    do {
      if ((int)uVar11 < iVar16) {
        uVar3 = wrk->fx_scale;
        iVar1 = wrk->x_add;
        iVar2 = wrk->x_sub;
        prVar13 = wrk->frow;
        iVar14 = 0;
        uVar20 = 0;
        uVar15 = uVar11 & 0xffffffff;
        uVar18 = uVar11;
        do {
          uVar19 = (uint)uVar20;
          bVar21 = SCARRY4(iVar14,iVar1);
          iVar14 = iVar14 + iVar1;
          if (iVar14 == 0 || bVar21 != iVar14 < 0) {
            uVar17 = 0;
          }
          else {
            lVar10 = 0;
            do {
              iVar14 = iVar14 - wrk->x_sub;
              uVar17 = (uint)src[lVar10 + (int)uVar15];
              uVar19 = (int)uVar20 + (uint)src[lVar10 + (int)uVar15];
              uVar20 = (ulong)uVar19;
              lVar10 = lVar10 + uVar9;
            } while (0 < iVar14);
            uVar15 = (ulong)(uint)((int)uVar15 + (int)lVar10);
          }
          prVar13[uVar18] = uVar19 * iVar2 + uVar17 * iVar14;
          uVar18 = uVar18 + uVar9;
          uVar20 = (ulong)-(uVar17 * iVar14) * (ulong)uVar3 + 0x80000000 >> 0x20;
        } while ((int)uVar18 < iVar16);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar9);
  }
  return;
}

Assistant:

static void RescalerImportRowShrink_SSE2(WebPRescaler* WEBP_RESTRICT const wrk,
                                         const uint8_t* WEBP_RESTRICT src) {
  const int x_sub = wrk->x_sub;
  int accum = 0;
  const __m128i zero = _mm_setzero_si128();
  const __m128i mult0 = _mm_set1_epi16(x_sub);
  const __m128i mult1 = _mm_set1_epi32(wrk->fx_scale);
  const __m128i rounder = _mm_set_epi32(0, ROUNDER, 0, ROUNDER);
  __m128i sum = zero;
  rescaler_t* frow = wrk->frow;
  const rescaler_t* const frow_end = wrk->frow + 4 * wrk->dst_width;

  if (wrk->num_channels != 4 || wrk->x_add > (x_sub << 7)) {
    WebPRescalerImportRowShrink_C(wrk, src);
    return;
  }
  assert(!WebPRescalerInputDone(wrk));
  assert(!wrk->x_expand);

  for (; frow < frow_end; frow += 4) {
    __m128i base = zero;
    accum += wrk->x_add;
    while (accum > 0) {
      const __m128i A = _mm_cvtsi32_si128(WebPMemToInt32(src));
      src += 4;
      base = _mm_unpacklo_epi8(A, zero);
      // To avoid overflow, we need: base * x_add / x_sub < 32768
      // => x_add < x_sub << 7. That's a 1/128 reduction ratio limit.
      sum = _mm_add_epi16(sum, base);
      accum -= x_sub;
    }
    {    // Emit next horizontal pixel.
      const __m128i mult = _mm_set1_epi16(-accum);
      const __m128i frac0 = _mm_mullo_epi16(base, mult);  // 16b x 16b -> 32b
      const __m128i frac1 = _mm_mulhi_epu16(base, mult);
      const __m128i frac = _mm_unpacklo_epi16(frac0, frac1);  // frac is 32b
      const __m128i A0 = _mm_mullo_epi16(sum, mult0);
      const __m128i A1 = _mm_mulhi_epu16(sum, mult0);
      const __m128i B0 = _mm_unpacklo_epi16(A0, A1);      // sum * x_sub
      const __m128i frow_out = _mm_sub_epi32(B0, frac);   // sum * x_sub - frac
      const __m128i D0 = _mm_srli_epi64(frac, 32);
      const __m128i D1 = _mm_mul_epu32(frac, mult1);      // 32b x 16b -> 64b
      const __m128i D2 = _mm_mul_epu32(D0, mult1);
      const __m128i E1 = _mm_add_epi64(D1, rounder);
      const __m128i E2 = _mm_add_epi64(D2, rounder);
      const __m128i F1 = _mm_shuffle_epi32(E1, 1 | (3 << 2));
      const __m128i F2 = _mm_shuffle_epi32(E2, 1 | (3 << 2));
      const __m128i G = _mm_unpacklo_epi32(F1, F2);
      sum = _mm_packs_epi32(G, zero);
      _mm_storeu_si128((__m128i*)frow, frow_out);
    }
  }
  assert(accum == 0);
}